

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O0

void do_ds(int *ip)

{
  int iVar1;
  uint local_14;
  int addr;
  uint limit;
  int *ip_local;
  
  local_14 = 0;
  labldef(loccnt,1);
  iVar1 = evaluate(ip,';');
  if (iVar1 != 0) {
    if (section == 0) {
      local_14 = machine->zp_limit;
    }
    else if (section == 1) {
      local_14 = machine->ram_limit;
    }
    else if (section - 2U < 2) {
      local_14 = 0x2000;
    }
    if (local_14 < loccnt + value) {
      error("Out of range!");
    }
    else {
      iVar1 = loccnt + value;
      if (section == 0) {
        if (max_zp < iVar1) {
          max_zp = iVar1;
        }
      }
      else if ((section == 1) && (max_bss < iVar1)) {
        max_bss = iVar1;
      }
      if (pass == 1) {
        if (section == 2 || section == 3) {
          memset(rom[bank] + loccnt,0,(ulong)value);
          memset(map[bank] + loccnt,section + page * 0x20 & 0xff,(ulong)value);
          if (max_bank < bank) {
            max_bank = bank;
          }
        }
        loadlc(loccnt,0);
        println();
      }
      loccnt = value + loccnt;
    }
  }
  return;
}

Assistant:

void
do_ds(int *ip)
{
	unsigned int limit = 0;
	int addr;

	/* define label */
	labldef(loccnt, 1);

	/* get the number of bytes to reserve */
	if (!evaluate(ip, ';'))
		return;

	/* section switch */
	switch (section) {
	case S_ZP:
		/* zero page section */
		limit = machine->zp_limit;
		break;

	case S_BSS:
		/* ram section */
		limit = machine->ram_limit;
		break;

	case S_CODE:
	case S_DATA:
		/* code and data sections */
		limit = 0x2000;
		break;
	}

	/* check range */
	if ((loccnt + value) > limit) {
		error("Out of range!");
		return;
	}

	/* update max counter for zp and bss sections */
	addr = loccnt + value;

	switch (section) {
	case S_ZP:
		/* zero page */
		if (addr > max_zp)
			max_zp = addr;
		break;

	case S_BSS:
		/* ram page */
		if (addr > max_bss)
			max_bss = addr;
		break;
	}

	/* output line on last pass */
	if (pass == LAST_PASS) {
		switch (section) {
		case S_CODE:
		case S_DATA:
			memset(&rom[bank][loccnt], 0, value);
			memset(&map[bank][loccnt], section + (page << 5), value);
			if (bank > max_bank)
				max_bank = bank;
			break;
		}
		loadlc(loccnt, 0);
		println();
	}

	/* update location counter */
	loccnt += value;
}